

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

char * StringFromMD5(LPBYTE md5,char *szBuffer)

{
  char *pcVar1;
  char *szBuffer_local;
  LPBYTE md5_local;
  
  pcVar1 = StringFromBinary(md5,0x10,szBuffer);
  return pcVar1;
}

Assistant:

char * StringFromMD5(LPBYTE md5, char * szBuffer)
{
    return StringFromBinary(md5, MD5_HASH_SIZE, szBuffer);
}